

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O3

void __thiscall
AI::HierarchicalTaskNetworkComponent::updateHUD_PlanPath(HierarchicalTaskNetworkComponent *this)

{
  pointer pTVar1;
  pointer pbVar2;
  World *this_00;
  GameMode *this_01;
  TaskDatabase *this_02;
  mapped_type *pmVar3;
  char *__s;
  char *pcVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  this_02 = GameMode::getAvailableTasks(this_01);
  lVar7 = 0;
  lVar6 = 0;
  uVar5 = 0;
  do {
    pTVar1 = (this->planner).plan.planPath.
             super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)((long)(this->planner).plan.planPath.
                              super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 2)) {
      pmVar3 = std::
               map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
               ::operator[](&this_02->tasks,(key_type *)((long)pTVar1 + lVar6));
      __s = (pmVar3->debugName)._M_dataplus._M_p;
      pbVar2 = (this->planPath).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar4 = *(char **)((long)&pbVar2->_M_string_length + lVar7);
      strlen(__s);
    }
    else {
      pbVar2 = (this->planPath).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar4 = *(char **)((long)&pbVar2->_M_string_length + lVar7);
      __s = "";
    }
    std::__cxx11::string::_M_replace((long)&(pbVar2->_M_dataplus)._M_p + lVar7,0,pcVar4,(ulong)__s);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 4;
    lVar7 = lVar7 + 0x20;
  } while (uVar5 != 5);
  this->planProgress =
       (float)((long)(this->planner).plan.currentPathVertex._M_current +
               (4 - (long)(this->planner).plan.planPath.
                          super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) / 5.0;
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::updateHUD_PlanPath()
{
	auto& tasks = getWorld()->getAuthGameMode()->getAvailableTasks();

	for (std::size_t i = 0; i < 5u; i++)
	{
		if (i < planner.plan.planPath.size())
		{
			planPath[i] = tasks.tasks[planner.plan.planPath[i]].debugName.c_str(); 
		}
		else
		{
			planPath[i] = "";
		}
	}

	planProgress = (1 + planner.plan.currentPathVertex - begin(planner.plan.planPath)) / 5.f;
}